

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::UniformLocNegativeCompileNonNumberLiteral::Run
          (UniformLocNegativeCompileNonNumberLiteral *this)

{
  string additionalDef;
  long lVar1;
  string def;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 *puVar2;
  undefined8 in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"layout (location = x) uniform float u0;","");
  puVar2 = &stack0xffffffffffffffb0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffa0,local_40,local_38 + (long)local_40);
  additionalDef._M_string_length = (size_type)puVar2;
  additionalDef._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff98;
  additionalDef.field_2._M_allocated_capacity = in_stack_ffffffffffffffa8;
  additionalDef.field_2._8_8_ = in_stack_ffffffffffffffb0;
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeCompile
                    (&this->super_ExplicitUniformLocationCaseBase,additionalDef);
  if (puVar2 != &stack0xffffffffffffffb0) {
    operator_delete(puVar2,in_stack_ffffffffffffffb0 + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return lVar1;
}

Assistant:

virtual long Run()
	{
		std::string def = "layout (location = x) uniform float u0;";
		return doRunNegativeCompile(def);
	}